

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes.c
# Opt level: O1

int cvSensRhs1InternalDQ
              (int Ns,sunrealtype t,N_Vector y,N_Vector ydot,int is,N_Vector yS,N_Vector ySdot,
              void *cvode_mem,N_Vector ytemp,N_Vector ftemp)

{
  double dVar1;
  double dVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  N_Vector Xvecs [3];
  sunrealtype cvals [3];
  undefined4 local_a8;
  N_Vector local_68;
  N_Vector local_60;
  N_Vector local_58;
  undefined8 local_48;
  double local_40;
  double local_38;
  
  dVar6 = *(double *)((long)cvode_mem + 0x28);
  if (*(double *)((long)cvode_mem + 0x28) <= *(double *)((long)cvode_mem + 8)) {
    dVar6 = *(double *)((long)cvode_mem + 8);
  }
  dVar7 = 0.0;
  if (0.0 < dVar6) {
    if (dVar6 < 0.0) {
      dVar7 = sqrt(dVar6);
    }
    else {
      dVar7 = SQRT(dVar6);
    }
  }
  dVar6 = *(double *)(*(long *)((long)cvode_mem + 0xc0) + (long)is * 8);
  lVar5 = (long)*(int *)(*(long *)((long)cvode_mem + 200) + (long)is * 4);
  dVar1 = *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8);
  dVar2 = dVar7 * dVar6;
  dVar8 = 1.0 / dVar2;
  dVar9 = (double)N_VWrmsNorm(yS,*(undefined8 *)((long)cvode_mem + 0x1b8));
  dVar10 = dVar9 * dVar6;
  if (dVar9 * dVar6 <= 1.0 / dVar7) {
    dVar10 = 1.0 / dVar7;
  }
  dVar10 = dVar10 / dVar6;
  dVar7 = 1.0 / dVar10;
  dVar6 = *(double *)((long)cvode_mem + 0xd8);
  if ((dVar6 != 0.0) || (NAN(dVar6))) {
    dVar11 = dVar8 * dVar7;
    dVar9 = 1.0 / dVar11;
    if (1.0 / dVar11 <= dVar11) {
      dVar9 = dVar11;
    }
    if (dVar9 <= dVar6) {
      switch(*(int *)((long)cvode_mem + 0xd0) != 1) {
      case true:
        goto switchD_00112e14_caseD_1;
      }
      goto switchD_00112e14_caseD_0;
    }
    local_68 = ySdot;
    switch(*(int *)((long)cvode_mem + 0xd0) != 1) {
    case false:
      N_VLinearSum(0x3ff0000000000000,y,yS,ytemp);
      iVar3 = (**(code **)((long)cvode_mem + 0x10))
                        (t,ytemp,ySdot,*(undefined8 *)((long)cvode_mem + 0x18));
      if (iVar3 != 0) {
        return iVar3;
      }
      local_a8 = SUB84(dVar7,0);
      N_VLinearSum(0x3ff0000000000000,local_a8,y,yS,ytemp);
      iVar3 = (**(code **)((long)cvode_mem + 0x10))
                        (t,ytemp,ftemp,*(undefined8 *)((long)cvode_mem + 0x18));
      if (iVar3 != 0) {
        return iVar3;
      }
      N_VLinearSum(0.5 / dVar7,SUB84(0.5 / dVar7,0),ySdot,ftemp,ySdot);
      *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8) = dVar2 + dVar1;
      iVar3 = (**(code **)((long)cvode_mem + 0x10))
                        (t,y,ytemp,*(undefined8 *)((long)cvode_mem + 0x18));
      if (iVar3 != 0) {
        return iVar3;
      }
      *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8) = dVar1 - dVar2;
      iVar3 = (**(code **)((long)cvode_mem + 0x10))
                        (t,y,ftemp,*(undefined8 *)((long)cvode_mem + 0x18));
      if (iVar3 != 0) {
        return iVar3;
      }
      local_40 = 0.5 / dVar2;
      local_48 = 0x3ff0000000000000;
      local_60 = ytemp;
      local_38 = -local_40;
      local_58 = ftemp;
      iVar3 = N_VLinearCombination(3,&local_48,&local_68,ySdot);
      if (iVar3 != 0) {
        return -0x1c;
      }
      lVar4 = 4;
      goto LAB_001130d2;
    case true:
      N_VLinearSum(0x3ff0000000000000,y,yS,ytemp);
      iVar3 = (**(code **)((long)cvode_mem + 0x10))
                        (t,ytemp,ySdot,*(undefined8 *)((long)cvode_mem + 0x18));
      if (iVar3 != 0) {
        return iVar3;
      }
      N_VLinearSum(dVar10,SUB84(dVar10,0),ySdot,ydot,ySdot);
      *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8) = dVar2 + dVar1;
      iVar3 = (**(code **)((long)cvode_mem + 0x10))
                        (t,y,ytemp,*(undefined8 *)((long)cvode_mem + 0x18));
      if (iVar3 != 0) {
        return iVar3;
      }
      local_48 = 0x3ff0000000000000;
      local_60 = ytemp;
      local_38 = -dVar8;
      local_58 = ydot;
      local_40 = dVar8;
      iVar3 = N_VLinearCombination(3,&local_48,&local_68,ySdot);
      if (iVar3 != 0) {
        return -0x1c;
      }
    }
  }
  else {
    switch(*(int *)((long)cvode_mem + 0xd0) != 1) {
    case true:
switchD_00112e14_caseD_1:
      if (dVar2 <= dVar7) {
        dVar7 = dVar2;
      }
      N_VLinearSum(0x3ff0000000000000,y,yS,ytemp);
      *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8) = dVar1 + dVar7;
      iVar3 = (**(code **)((long)cvode_mem + 0x10))
                        (t,ytemp,ySdot,*(undefined8 *)((long)cvode_mem + 0x18));
      if (iVar3 != 0) {
        return iVar3;
      }
      N_VLinearSum(1.0 / dVar7,SUB84(1.0 / dVar7,0),ySdot,ydot,ySdot);
      lVar4 = 1;
      goto LAB_001130d2;
    }
switchD_00112e14_caseD_0:
    if (dVar2 <= dVar7) {
      dVar7 = dVar2;
    }
    N_VLinearSum(0x3ff0000000000000,y,yS,ytemp);
    *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8) = dVar1 + dVar7;
    iVar3 = (**(code **)((long)cvode_mem + 0x10))
                      (t,ytemp,ySdot,*(undefined8 *)((long)cvode_mem + 0x18));
    if (iVar3 != 0) {
      return iVar3;
    }
    local_a8 = SUB84(dVar7,0);
    N_VLinearSum(0x3ff0000000000000,local_a8,y,yS,ytemp);
    *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8) = dVar1 - dVar7;
    iVar3 = (**(code **)((long)cvode_mem + 0x10))
                      (t,ytemp,ftemp,*(undefined8 *)((long)cvode_mem + 0x18));
    if (iVar3 != 0) {
      return iVar3;
    }
    N_VLinearSum(0.5 / dVar7,SUB84(0.5 / dVar7,0),ySdot,ftemp,ySdot);
  }
  lVar4 = 2;
LAB_001130d2:
  *(double *)(*(long *)((long)cvode_mem + 0xb8) + lVar5 * 8) = dVar1;
  *(long *)((long)cvode_mem + 0x648) = *(long *)((long)cvode_mem + 0x648) + lVar4;
  return 0;
}

Assistant:

int cvSensRhs1InternalDQ(SUNDIALS_MAYBE_UNUSED int Ns, sunrealtype t, N_Vector y,
                         N_Vector ydot, int is, N_Vector yS, N_Vector ySdot,
                         void* cvode_mem, N_Vector ytemp, N_Vector ftemp)
{
  CVodeMem cv_mem;
  int retval, method;
  int nfel = 0, which;
  sunrealtype psave, pbari;
  sunrealtype delta, rdelta;
  sunrealtype Deltap, rDeltap, r2Deltap;
  sunrealtype Deltay, rDeltay, r2Deltay;
  sunrealtype Delta, rDelta, r2Delta;
  sunrealtype norms, ratio;

  /* local variables for fused vector operations */
  sunrealtype cvals[3];
  N_Vector Xvecs[3];

  /* cvode_mem is passed here as user data */
  cv_mem = (CVodeMem)cvode_mem;

  delta  = SUNRsqrt(SUNMAX(cv_mem->cv_reltol, cv_mem->cv_uround));
  rdelta = ONE / delta;

  pbari = cv_mem->cv_pbar[is];

  which = cv_mem->cv_plist[is];

  psave = cv_mem->cv_p[which];

  Deltap  = pbari * delta;
  rDeltap = ONE / Deltap;
  norms   = N_VWrmsNorm(yS, cv_mem->cv_ewt) * pbari;
  rDeltay = SUNMAX(norms, rdelta) / pbari;
  Deltay  = ONE / rDeltay;

  if (cv_mem->cv_DQrhomax == ZERO)
  {
    /* No switching */
    method = (cv_mem->cv_DQtype == CV_CENTERED) ? CENTERED1 : FORWARD1;
  }
  else
  {
    /* switch between simultaneous/separate DQ */
    ratio = Deltay * rDeltap;
    if (SUNMAX(ONE / ratio, ratio) <= cv_mem->cv_DQrhomax)
    {
      method = (cv_mem->cv_DQtype == CV_CENTERED) ? CENTERED1 : FORWARD1;
    }
    else { method = (cv_mem->cv_DQtype == CV_CENTERED) ? CENTERED2 : FORWARD2; }
  }

  switch (method)
  {
  case CENTERED1:

    Delta   = SUNMIN(Deltay, Deltap);
    r2Delta = HALF / Delta;

    N_VLinearSum(ONE, y, Delta, yS, ytemp);
    cv_mem->cv_p[which] = psave + Delta;

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(ONE, y, -Delta, yS, ytemp);
    cv_mem->cv_p[which] = psave - Delta;

    retval = cv_mem->cv_f(t, ytemp, ftemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(r2Delta, ySdot, -r2Delta, ftemp, ySdot);

    break;

  case CENTERED2:

    r2Deltap = HALF / Deltap;
    r2Deltay = HALF / Deltay;

    N_VLinearSum(ONE, y, Deltay, yS, ytemp);

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(ONE, y, -Deltay, yS, ytemp);

    retval = cv_mem->cv_f(t, ytemp, ftemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(r2Deltay, ySdot, -r2Deltay, ftemp, ySdot);

    cv_mem->cv_p[which] = psave + Deltap;
    retval              = cv_mem->cv_f(t, y, ytemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    cv_mem->cv_p[which] = psave - Deltap;
    retval              = cv_mem->cv_f(t, y, ftemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    /* ySdot = ySdot + r2Deltap * ytemp - r2Deltap * ftemp */
    cvals[0] = ONE;
    Xvecs[0] = ySdot;
    cvals[1] = r2Deltap;
    Xvecs[1] = ytemp;
    cvals[2] = -r2Deltap;
    Xvecs[2] = ftemp;

    retval = N_VLinearCombination(3, cvals, Xvecs, ySdot);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    break;

  case FORWARD1:

    Delta  = SUNMIN(Deltay, Deltap);
    rDelta = ONE / Delta;

    N_VLinearSum(ONE, y, Delta, yS, ytemp);
    cv_mem->cv_p[which] = psave + Delta;

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(rDelta, ySdot, -rDelta, ydot, ySdot);

    break;

  case FORWARD2:

    N_VLinearSum(ONE, y, Deltay, yS, ytemp);

    retval = cv_mem->cv_f(t, ytemp, ySdot, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    N_VLinearSum(rDeltay, ySdot, -rDeltay, ydot, ySdot);

    cv_mem->cv_p[which] = psave + Deltap;
    retval              = cv_mem->cv_f(t, y, ytemp, cv_mem->cv_user_data);
    nfel++;
    if (retval != 0) { return (retval); }

    /* ySdot = ySdot + rDeltap * ytemp - rDeltap * ydot */
    cvals[0] = ONE;
    Xvecs[0] = ySdot;
    cvals[1] = rDeltap;
    Xvecs[1] = ytemp;
    cvals[2] = -rDeltap;
    Xvecs[2] = ydot;

    retval = N_VLinearCombination(3, cvals, Xvecs, ySdot);
    if (retval != CV_SUCCESS) { return (CV_VECTOROP_ERR); }

    break;
  }

  cv_mem->cv_p[which] = psave;

  /* Increment counter nfeS */
  cv_mem->cv_nfeS += nfel;

  return (0);
}